

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O3

void zdd_writer_writetext(FILE *out,sylvan_skiplist_t sl)

{
  uint8_t *puVar1;
  size_t sVar2;
  MTBDD MVar3;
  uint64_t uVar4;
  ulong dd;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  uint64_t index;
  
  index = 1;
  fwrite("[\n",2,1,(FILE *)out);
  sVar2 = sylvan_skiplist_count(sl);
  if (sVar2 != 0) {
    do {
      MVar3 = sylvan_skiplist_getr(sl,index);
      puVar1 = nodes->data;
      lVar7 = (MVar3 & 0xffffffffff) * 0x10;
      uVar6 = *(ulong *)(puVar1 + lVar7);
      dd = *(ulong *)(puVar1 + lVar7 + 8) & 0xffffffffff;
      if (1 < dd) {
        uVar4 = sylvan_skiplist_get(sl,dd);
        dd = uVar4 & 0xffffffffff;
      }
      if ((uVar6 & 0xffffffffff) < 2) {
        uVar6 = uVar6 & 0x800000ffffffffff;
      }
      else {
        uVar4 = sylvan_skiplist_get(sl,uVar6 & 0xffffffffff);
        uVar6 = uVar6 & 0x8000000000000000 | uVar4 & 0xffffffffff;
      }
      pcVar5 = "~";
      if (-1 < (long)uVar6) {
        pcVar5 = "";
      }
      fprintf((FILE *)out,"  node(%zu,%u,low(%zu),%shigh(%zu)),\n",index,
              *(ulong *)(puVar1 + lVar7 + 8) >> 0x28,dd,pcVar5,uVar6 & 0xffffffffff);
      index = index + 1;
    } while (index <= sVar2);
  }
  fputc(0x5d,(FILE *)out);
  return;
}

Assistant:

void
zdd_writer_writetext(FILE *out, sylvan_skiplist_t sl)
{
    fprintf(out, "[\n");
    size_t nodecount = sylvan_skiplist_count(sl);
    for (size_t i=1; i<=nodecount; i++) {
        ZDD dd = sylvan_skiplist_getr(sl, i);

        zddnode_t n = ZDD_GETNODE(dd);
        ZDD low = zddnode_getlow(n);
        ZDD high = zddnode_gethigh(n);
        if (ZDD_GETINDEX(low) > 1) low = ZDD_SETINDEX(low, sylvan_skiplist_get(sl, ZDD_GETINDEX(low)));
        if (ZDD_GETINDEX(high) > 1) high = ZDD_SETINDEX(high, sylvan_skiplist_get(sl, ZDD_GETINDEX(high)));
        fprintf(out, "  node(%zu,%u,low(%zu),%shigh(%zu)),\n", i, zddnode_getvariable(n), (size_t)ZDD_GETINDEX(low), ZDD_HASMARK(high)?"~":"", (size_t)ZDD_GETINDEX(high));
    }

    fprintf(out, "]");
}